

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O3

error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_gsl::span<typename_span<frame_fixed_layout,__1L>::element_type>_>
* __thiscall
pstore::http::
buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>const&)>
::get_span<pstore::gsl::span<pstore::http::frame_fixed_layout,_1l>>
          (error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_gsl::span<typename_span<frame_fixed_layout,__1L>::element_type>_>
           *__return_storage_ptr__,
          buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>
          *this,descriptor<pstore::details::posix_descriptor_traits> *io,
          span<pstore::http::frame_fixed_layout,__1L> *sp)

{
  pointer peVar1;
  anon_class_1_0_00000001 cast;
  anon_class_1_0_00000001 local_69;
  error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_byte_span>
  local_68;
  byte_span local_48;
  extent_type<_1L> local_38 [2];
  
  peVar1 = (sp->storage_).data_;
  pstore::gsl::details::extent_type<-1L>::extent_type
            (local_38,(sp->storage_).super_extent_type<_1L>.size_ * 2);
  local_48.storage_.super_extent_type<_1L>.size_ = local_38[0].size_;
  local_48.storage_.data_ = (pointer)peVar1;
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::get_span_impl(&local_68,
                  (buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                   *)this,io,&local_48);
  pstore::operator>>=((error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_gsl::span<element_type>_>
                       *)__return_storage_ptr__,&local_68,&local_69);
  if (local_68.has_error_ == false) {
    error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>>>
    ::
    value_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>>&,std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>>
              (&local_68);
  }
  else {
    error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>>>
    ::
    error_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>>>&,std::error_code>
              (&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

auto buffered_reader<IO, RefillFunction>::get_span (IO io, SpanType const & sp)
            -> error_or_n<IO, gsl::span<typename SpanType::element_type>> {

            auto cast = [] (IO io2, byte_span const & sp2) {
                using element_type = typename SpanType::element_type;
                using index_type = typename SpanType::index_type;
                auto const first = reinterpret_cast<element_type *> (sp2.data ());
                auto const elements =
                    std::max (sp2.size (), index_type{0}) / index_type{sizeof (element_type)};
                return error_or_n<IO, gsl::span<element_type>>{
                    in_place, io2, gsl::make_span (first, first + elements)};
            };
            return this->get_span_impl (io, as_writeable_bytes (sp)) >>= cast;
        }